

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  size_type sVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  char cVar5;
  
  pcVar2 = (this->pathname_)._M_dataplus._M_p;
  sVar1 = (this->pathname_)._M_string_length;
  pcVar3 = pcVar2;
  if (sVar1 != 0) {
    sVar4 = 0;
    do {
      cVar5 = pcVar2[sVar4];
      if (((cVar5 != '/') || (cVar5 = '/', pcVar3 == (this->pathname_)._M_dataplus._M_p)) ||
         (pcVar3[-1] != '/')) {
        *pcVar3 = cVar5;
        pcVar3 = pcVar3 + 1;
      }
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
    pcVar2 = (this->pathname_)._M_dataplus._M_p;
  }
  (this->pathname_)._M_string_length = (long)pcVar3 - (long)pcVar2;
  *pcVar3 = '\0';
  return;
}

Assistant:

void FilePath::Normalize() {
  auto out = pathname_.begin();

  for (const char character : pathname_) {
    if (!IsPathSeparator(character)) {
      *(out++) = character;
    } else if (out == pathname_.begin() || *std::prev(out) != kPathSeparator) {
      *(out++) = kPathSeparator;
    } else {
      continue;
    }
  }

  pathname_.erase(out, pathname_.end());
}